

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

string * showClause_abi_cxx11_(string *__return_storage_ptr__,Clause *c)

{
  ostream *poVar1;
  uint i;
  stringstream ss;
  int in_stack_fffffffffffffe1c;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  for (i = 0; i < *(uint *)c >> 8; i = i + 1) {
    poVar1 = std::operator<<(local_1a8," ");
    Clause::operator[](c,i);
    getLitString_abi_cxx11_(in_stack_fffffffffffffe1c);
    std::operator<<(poVar1,local_1d8);
    std::__cxx11::string::~string(local_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string showClause(Clause& c) {
	std::stringstream ss;
	for (unsigned int i = 0; i < c.size(); i++) {
		ss << " " << getLitString(toInt(c[i]));
	}
	return ss.str();
}